

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

bool __thiscall QAuthenticator::operator==(QAuthenticator *this,QAuthenticator *other)

{
  bool bVar1;
  long *in_RSI;
  QString *in_RDI;
  uint7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  if ((in_RDI->d).d == (Data *)*in_RSI) {
    local_1 = true;
  }
  else if (((in_RDI->d).d == (Data *)0x0) || (*in_RSI == 0)) {
    local_1 = false;
  }
  else {
    bVar1 = ::operator==(in_RDI,(QString *)
                                CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    local_1 = false;
    if (bVar1) {
      bVar1 = ::operator==(in_RDI,(QString *)(ulong)in_stack_ffffffffffffffd8);
      local_1 = false;
      if (bVar1) {
        bVar1 = ::operator==(in_RDI,(QString *)(ulong)in_stack_ffffffffffffffd8);
        local_1 = false;
        if ((bVar1) &&
           (local_1 = false,
           (in_RDI->d).d[5].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
           *(int *)(*in_RSI + 0x50))) {
          local_1 = operator==<QString,_QVariant,_true>
                              ((QHash<QString,_QVariant> *)in_RDI,
                               (QHash<QString,_QVariant> *)(ulong)in_stack_ffffffffffffffd8);
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool QAuthenticator::operator==(const QAuthenticator &other) const
{
    if (d == other.d)
        return true;
    if (!d || !other.d)
        return false;
    return d->user == other.d->user
        && d->password == other.d->password
        && d->realm == other.d->realm
        && d->method == other.d->method
        && d->options == other.d->options;
}